

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec10.c
# Opt level: O0

int If_Dec10Perform(word *pF,int nVars,int fDerive)

{
  int iVar1;
  int local_844;
  int local_840;
  int x;
  int v;
  int i3;
  int i2;
  int i1;
  int i0;
  int i;
  int Masks [210];
  int Count [210];
  int local_188 [2];
  int Var2Pla [10];
  int local_158 [2];
  int Pla2Var [10];
  word local_128;
  word pCof1 [16];
  word pCof0 [16];
  int fDerive_local;
  int nVars_local;
  word *pF_local;
  
  if ((nVars < 6) || (10 < nVars)) {
    __assert_fail("nVars >= 6 && nVars <= 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0x184,"int If_Dec10Perform(word *, int, int)");
  }
  for (i1 = 0; i1 < nVars; i1 = i1 + 1) {
    iVar1 = If_Dec10HasVar(pF,nVars,i1);
    if (iVar1 == 0) {
      __assert_fail("If_Dec10HasVar( pF, nVars, i )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                    ,0x188,"int If_Dec10Perform(word *, int, int)");
    }
    Var2Pla[(long)i1 + -2] = i1;
    Pla2Var[(long)i1 + -2] = i1;
  }
  local_840 = 0;
  i2 = 0;
  do {
    iVar1 = i2;
    if (nVars <= i2) {
      if (0xd2 < local_840) {
        __assert_fail("v <= 210",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                      ,0x1b4,"int If_Dec10Perform(word *, int, int)");
      }
      i2 = 0;
      do {
        i3 = i2;
        if (local_840 <= i2) {
          return 0;
        }
        while (i3 = i3 + 1, i3 < local_840) {
          iVar1 = If_Dec10Count16((&i0)[i2] & (&i0)[i3]);
          if (iVar1 <= 10 - nVars) {
            if (nVars == 10) {
              if ((Count[(long)i2 + -2] == 2) && (Count[(long)i3 + -2] == 2)) {
                return 1;
              }
            }
            else if (nVars == 9) {
              if ((((Count[(long)i2 + -2] == 2) && (Count[(long)i3 + -2] == 2)) ||
                  ((Count[(long)i2 + -2] == 2 && (Count[(long)i3 + -2] < 0)))) ||
                 ((Count[(long)i2 + -2] < 0 && (Count[(long)i3 + -2] == 2)))) {
                return 1;
              }
            }
            else if (((((Count[(long)i2 + -2] == 2) && (Count[(long)i3 + -2] == 2)) ||
                      ((Count[(long)i2 + -2] == 2 && (Count[(long)i3 + -2] < 0)))) ||
                     ((Count[(long)i2 + -2] < 0 && (Count[(long)i3 + -2] == 2)))) ||
                    ((Count[(long)i2 + -2] < 0 && (Count[(long)i3 + -2] < 0)))) {
              return 1;
            }
          }
        }
        i2 = i2 + 1;
      } while( true );
    }
    while (i3 = iVar1 + 1, i3 < nVars) {
      for (v = iVar1 + 2; iVar1 = i3, x = v, v < nVars; v = v + 1) {
        while (x = x + 1, x < nVars) {
          If_Dec10MoveTo(pF,nVars,i2,nVars + -1,local_158,local_188);
          If_Dec10MoveTo(pF,nVars,i3,nVars + -2,local_158,local_188);
          If_Dec10MoveTo(pF,nVars,v,nVars + -3,local_158,local_188);
          If_Dec10MoveTo(pF,nVars,x,nVars + -4,local_158,local_188);
          If_DecVerifyPerm(local_158,local_188,nVars);
          iVar1 = If_Dec10CofCount(pF,nVars);
          Count[(long)local_840 + -2] = iVar1;
          (&i0)[local_840] =
               1 << ((byte)i2 & 0x1f) | 1 << ((byte)i3 & 0x1f) | 1 << ((byte)v & 0x1f) |
               1 << ((byte)x & 0x1f);
          if (Count[(long)local_840 + -2] < 2) {
            __assert_fail("Count[v] > 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                          ,0x1a5,"int If_Dec10Perform(word *, int, int)");
          }
          if ((Count[(long)local_840 + -2] != 2) && (Count[(long)local_840 + -2] < 6)) {
            for (local_844 = 0; local_844 < 4; local_844 = local_844 + 1) {
              If_Dec10Cofactors(pF,nVars,(nVars + -1) - local_844,pCof1 + 0xf,&local_128);
              iVar1 = If_Dec10CofCount2(pCof1 + 0xf,nVars);
              if ((iVar1 < 3) && (iVar1 = If_Dec10CofCount2(&local_128,nVars), iVar1 < 3)) {
                Count[(long)local_840 + -2] = -Count[(long)local_840 + -2];
                break;
              }
            }
          }
          local_840 = local_840 + 1;
        }
      }
    }
    i2 = i2 + 1;
  } while( true );
}

Assistant:

int If_Dec10Perform( word * pF, int nVars, int fDerive )
{ 
//    static int Cnt = 0;
    word pCof0[16], pCof1[16];
    int Pla2Var[10], Var2Pla[10], Count[210], Masks[210];
    int i, i0,i1,i2,i3, v, x;
    assert( nVars >= 6 && nVars <= 10 );
    // start arrays
    for ( i = 0; i < nVars; i++ )
    {
        assert( If_Dec10HasVar( pF, nVars, i ) );
        Pla2Var[i] = Var2Pla[i] = i;
    }
/*
    Cnt++;
//if ( Cnt == 108 )
{
printf( "%d\n", Cnt );
//Extra_PrintHex( stdout, (unsigned *)pF, nVars );
//printf( "\n" ); 
Kit_DsdPrintFromTruth( (unsigned *)pF, nVars );
printf( "\n" );
printf( "\n" );
}
*/
    // generate permutations
    v = 0;
    for ( i0 = 0;    i0 < nVars; i0++ )
    for ( i1 = i0+1; i1 < nVars; i1++ )
    for ( i2 = i1+1; i2 < nVars; i2++ )
    for ( i3 = i2+1; i3 < nVars; i3++, v++ )
    {
        If_Dec10MoveTo( pF, nVars, i0, nVars-1, Pla2Var, Var2Pla );
        If_Dec10MoveTo( pF, nVars, i1, nVars-2, Pla2Var, Var2Pla );
        If_Dec10MoveTo( pF, nVars, i2, nVars-3, Pla2Var, Var2Pla );
        If_Dec10MoveTo( pF, nVars, i3, nVars-4, Pla2Var, Var2Pla );
        If_DecVerifyPerm( Pla2Var, Var2Pla, nVars );
        Count[v] = If_Dec10CofCount( pF, nVars );
        Masks[v] = (1 << i0) | (1 << i1) | (1 << i2) | (1 << i3);
        assert( Count[v] > 1 );
//printf( "%d ", Count[v] );
        if ( Count[v] == 2 || Count[v] > 5 )
            continue;
        for ( x = 0; x < 4; x++ )
        {
            If_Dec10Cofactors( pF, nVars, nVars-1-x, pCof0, pCof1 );
            if ( If_Dec10CofCount2(pCof0, nVars) <= 2 && If_Dec10CofCount2(pCof1, nVars) <= 2 )
            {
                Count[v] = -Count[v];
                break;
            }
        }
    }
//printf( "\n" );
    assert( v <= 210 );
    // check if there are compatible bound sets
    for ( i0 = 0; i0 < v; i0++ )
    for ( i1 = i0+1; i1 < v; i1++ )
    {
        if ( If_Dec10Count16(Masks[i0] & Masks[i1]) > 10 - nVars )
            continue;
        if ( nVars == 10 )
        {
            if ( Count[i0] == 2 && Count[i1] == 2 )
                return 1;
        }
        else if ( nVars == 9 )
        {
            if ( (Count[i0] == 2 && Count[i1] == 2) || 
                 (Count[i0] == 2 && Count[i1] <  0) || 
                 (Count[i0] <  0 && Count[i1] == 2) )
                return 1;
        }
        else
        {
            if ( (Count[i0] == 2 && Count[i1] == 2) || 
                 (Count[i0] == 2 && Count[i1] <  0) || 
                 (Count[i0] <  0 && Count[i1] == 2) || 
                 (Count[i0] <  0 && Count[i1] <  0) )
                return 1;
        }
    }
//    printf( "not found\n" );
    return 0;
}